

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

bool __thiscall BasePort::WriteQuadlet(BasePort *this,uchar boardId,nodeaddr_t addr,quadlet_t data)

{
  ushort uVar1;
  int iVar2;
  byte bVar3;
  
  bVar3 = boardId & 0x3f;
  if (bVar3 < 0x10) {
    uVar1 = this->Board2Node[bVar3];
  }
  else {
    uVar1 = (bVar3 != 0x3f) + 0x3f;
  }
  if (uVar1 < 0x40) {
    iVar2 = (*this->_vptr_BasePort[5])
                      (this,(ulong)uVar1,addr,data,(ulong)(boardId & 0xc0),this->_vptr_BasePort[5]);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

nodeid_t BasePort::ConvertBoardToNode(unsigned char boardId) const
{
    nodeid_t node = MAX_NODES;                  // Invalid value
    boardId = boardId&FW_NODE_MASK;
    if (boardId < BoardIO::MAX_BOARDS)
        node = GetNodeId(boardId);
    else if (boardId == FW_NODE_BROADCAST)
        node = FW_NODE_BROADCAST;
    return node;
}